

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

void __thiscall Camera::updateCameraVectors(Camera *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar3 = cosf(this->Yaw * 0.017453292);
  fVar4 = cosf(this->Pitch * 0.017453292);
  fVar4 = fVar4 * fVar3;
  fVar5 = sinf(this->Pitch * 0.017453292);
  fVar3 = sinf(this->Yaw * 0.017453292);
  fVar6 = cosf(this->Pitch * 0.017453292);
  fVar6 = fVar6 * fVar3;
  fVar7 = 1.0 / SQRT(fVar6 * fVar6 + fVar5 * fVar5 + fVar4 * fVar4);
  fVar4 = fVar4 * fVar7;
  fVar3 = (this->WorldUp).field_0.x;
  fVar5 = fVar7 * fVar5;
  fVar7 = fVar7 * fVar6;
  (this->Front).field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)fVar4;
  (this->Front).field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)fVar5;
  (this->Front).field_2.z = fVar7;
  uVar1 = (this->WorldUp).field_1;
  uVar2 = (this->WorldUp).field_2;
  fVar8 = (float)uVar2 * fVar5 - fVar7 * (float)uVar1;
  fVar6 = fVar3 * fVar7 - fVar4 * (float)uVar2;
  fVar3 = (float)uVar1 * fVar4 - fVar5 * fVar3;
  fVar10 = 1.0 / SQRT(fVar6 * fVar6 + fVar8 * fVar8 + fVar3 * fVar3);
  fVar3 = fVar3 * fVar10;
  fVar8 = fVar10 * fVar8;
  fVar10 = fVar10 * fVar6;
  (this->Right).field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)fVar8;
  (this->Right).field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)fVar10;
  (this->Right).field_2.z = fVar3;
  fVar9 = fVar10 * fVar7 - fVar3 * fVar5;
  fVar6 = fVar3 * fVar4 - fVar7 * fVar8;
  fVar4 = fVar8 * fVar5 - fVar10 * fVar4;
  fVar3 = 1.0 / SQRT(fVar4 * fVar4 + fVar6 * fVar6 + fVar9 * fVar9);
  (this->Up).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(fVar9 * fVar3);
  (this->Up).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar6 * fVar3);
  (this->Up).field_2.z = fVar3 * fVar4;
  return;
}

Assistant:

void Camera::updateCameraVectors() {
    vec3 front;
    front.x = cos(radians(Yaw)) * cos(radians(Pitch));
    front.y = sin(radians(Pitch));
    front.z = sin(radians(Yaw)) * cos(radians(Pitch));

    Front = normalize(front);

    Right = normalize(cross(Front, WorldUp));
    Up = normalize((cross(Right, Front)));
}